

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Persistence_landscape_on_grid.h
# Opt level: O3

double Gudhi::Persistence_representations::compute_max_norm_distance_of_landscapes
                 (Persistence_landscape_on_grid *first,Persistence_landscape_on_grid *second)

{
  pointer pvVar1;
  pointer pvVar2;
  pointer pvVar3;
  pointer pdVar4;
  long lVar5;
  undefined8 *puVar6;
  ulong uVar7;
  long lVar8;
  long lVar9;
  ulong uVar10;
  size_t j_1;
  ulong uVar11;
  size_t j;
  ulong uVar12;
  double dVar13;
  double dVar14;
  
  pvVar1 = (first->values_of_landscapes).
           super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pvVar2 = (first->values_of_landscapes).
           super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  lVar9 = (long)pvVar2 - (long)pvVar1;
  pvVar3 = (second->values_of_landscapes).
           super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (lVar9 == (long)(second->values_of_landscapes).
                     super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish - (long)pvVar3) {
    if ((first->grid_min == second->grid_min) && (!NAN(first->grid_min) && !NAN(second->grid_min)))
    {
      if ((first->grid_max == second->grid_max) && (!NAN(first->grid_max) && !NAN(second->grid_max))
         ) {
        if (pvVar2 == pvVar1) {
          dVar13 = 0.0;
        }
        else {
          dVar13 = 0.0;
          lVar8 = 0;
          do {
            pdVar4 = pvVar1[lVar8].super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start;
            uVar10 = (long)pvVar1[lVar8].super__Vector_base<double,_std::allocator<double>_>._M_impl
                           .super__Vector_impl_data._M_finish - (long)pdVar4 >> 3;
            lVar5 = *(long *)&pvVar3[lVar8].super__Vector_base<double,_std::allocator<double>_>.
                              _M_impl.super__Vector_impl_data;
            uVar11 = (long)*(pointer *)
                            ((long)&pvVar3[lVar8].
                                    super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                    super__Vector_impl_data + 8) - lVar5 >> 3;
            uVar12 = uVar10;
            if (uVar11 < uVar10) {
              uVar12 = uVar11;
            }
            if (uVar12 != 0) {
              uVar7 = 0;
              do {
                dVar14 = ABS(pdVar4[uVar7] - *(double *)(lVar5 + uVar7 * 8));
                if (dVar14 <= dVar13) {
                  dVar14 = dVar13;
                }
                dVar13 = dVar14;
                uVar7 = uVar7 + 1;
              } while (uVar12 != uVar7);
            }
            uVar12 = uVar10;
            dVar14 = dVar13;
            if (uVar10 < uVar11) {
              do {
                dVar13 = *(double *)(lVar5 + uVar12 * 8);
                if (dVar13 <= dVar14) {
                  dVar13 = dVar14;
                }
                uVar12 = uVar12 + 1;
                dVar14 = dVar13;
              } while (uVar11 != uVar12);
            }
            dVar14 = dVar13;
            if (uVar11 < uVar10) {
              do {
                dVar13 = pdVar4[uVar11];
                if (pdVar4[uVar11] <= dVar14) {
                  dVar13 = dVar14;
                }
                uVar11 = uVar11 + 1;
                dVar14 = dVar13;
              } while (uVar10 != uVar11);
            }
            lVar8 = lVar8 + 1;
          } while (lVar8 != (lVar9 >> 3) * -0x5555555555555555);
        }
        return dVar13;
      }
    }
  }
  puVar6 = (undefined8 *)__cxa_allocate_exception(8);
  *puVar6 = "Two grids are not compatible";
  __cxa_throw(puVar6,&char_const*::typeinfo,0);
}

Assistant:

void set_up_numbers_of_functions_for_vectorization_and_projections_to_reals() {
    // warning, this function can be only called after filling in the values_of_landscapes vector.
    this->number_of_functions_for_vectorization = this->values_of_landscapes.size();
    this->number_of_functions_for_projections_to_reals = this->values_of_landscapes.size();
  }